

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
::insert_at<char_const*const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<ValueType,unsigned_long,18446744073709551615ul>>
          *this,size_type pos,char **args)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  length_error *this_00;
  char *local_38;
  
  lVar3 = *(long *)(this + 0x58);
  if (lVar3 - *(long *)(this + 0x50) == -1) {
    this_00 = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this_00,"insert overflow");
    __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  if (*(long *)(this + 0x50) != 0) {
    local_38 = *(char **)(*(long *)(this + 0x78) + pos * 8);
    bVar2 = KeyInfo::equals<char_const*,char_const*>
                      ((KeyInfo *)(this + 0x30),(char **)(this + 0x40),&local_38);
    if (bVar2) {
      if (*(long *)(this + 0x50) == 0) {
        lVar3 = -1;
      }
      else {
        local_38 = *(char **)(*(long *)(this + 0x78) + pos * 8);
        KeyInfo::equals<char_const*,char_const*>
                  ((KeyInfo *)(this + 0x30),(char **)(this + 0x40),&local_38);
        lVar3 = *(long *)(this + 0x50) + -1;
      }
      *(long *)(this + 0x50) = lVar3;
      goto LAB_006506c4;
    }
    lVar3 = *(long *)(this + 0x58);
  }
  *(long *)(this + 0x58) = lVar3 + 1;
LAB_006506c4:
  *(char **)(*(long *)(this + 0x78) + pos * 8) = *args;
  lVar3 = *(long *)(this + 0x60);
  lVar1 = *(long *)(this + 0x78);
  __return_storage_ptr__->ht =
       (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
        *)this;
  __return_storage_ptr__->pos = (pointer)(lVar1 + pos * 8);
  __return_storage_ptr__->end = (pointer)(lVar1 + lVar3 * 8);
  return __return_storage_ptr__;
}

Assistant:

iterator insert_at(size_type pos, Args&&... args) {
    if (size() >= max_size()) {
      throw std::length_error("insert overflow");
    }
    if (test_deleted(pos)) {  // just replace if it's been del.
      // shrug: shouldn't need to be const.
      const_iterator delpos(this, table + pos, table + num_buckets, false);
      clear_deleted(delpos);
      assert(num_deleted > 0);
      --num_deleted;  // used to be, now it isn't
    } else {
      ++num_elements;  // replacing an empty bucket
    }
    set_value(&table[pos], std::forward<Args>(args)...);
    return iterator(this, table + pos, table + num_buckets, false);
  }